

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

void duckdb_je_sc_data_update_slab_size(sc_data_t *data,size_t begin,size_t end,int pgs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)data->nsizes;
  if (data->nsizes < 1) {
    uVar1 = uVar3;
  }
  for (; (uVar1 * 0x1c - uVar3 != 0 && ((&data->sc[0].bin)[uVar3] == true)); uVar3 = uVar3 + 0x1c) {
    uVar4 = ((long)*(int *)((long)&data->sc[0].ndelta + uVar3) <<
            (*(byte *)((long)&data->sc[0].lg_delta + uVar3) & 0x3f)) +
            (1L << (*(byte *)((long)&data->sc[0].lg_base + uVar3) & 0x3f));
    if (uVar4 <= end && begin <= uVar4) {
      uVar2 = ((uVar4 >> 0xc) + 1) - (ulong)((uVar4 & 0xfff) == 0);
      if ((ulong)(long)pgs < uVar2) {
        *(int *)((long)&data->sc[0].pgs + uVar3) = (int)uVar2;
      }
      else if ((uVar4 >> 3 & 0xfffffffffffff) < (ulong)(long)pgs) {
        *(int *)((long)&data->sc[0].pgs + uVar3) = (int)(uVar4 >> 3);
      }
      else {
        *(int *)((long)&data->sc[0].pgs + uVar3) = pgs;
      }
    }
  }
  return;
}

Assistant:

void
sc_data_update_slab_size(sc_data_t *data, size_t begin, size_t end, int pgs) {
	assert(data->initialized);
	for (int i = 0; i < data->nsizes; i++) {
		sc_t *sc = &data->sc[i];
		if (!sc->bin) {
			break;
		}
		size_t reg_size = reg_size_compute(sc->lg_base, sc->lg_delta,
		    sc->ndelta);
		if (begin <= reg_size && reg_size <= end) {
			sc_data_update_sc_slab_size(sc, reg_size, pgs);
		}
	}
}